

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u64 sqlite3LogEstToInt(LogEst x)

{
  char cVar1;
  long lVar2;
  ulong uVar3;
  ushort uVar4;
  
  uVar4 = x % 10;
  lVar2 = 0;
  if (uVar4 != 0) {
    lVar2 = (long)(short)uVar4 + -1;
  }
  if (4 < uVar4) {
    lVar2 = (long)(short)uVar4 + -2;
  }
  cVar1 = (char)(x / 10);
  uVar3 = lVar2 + 8U >> (3U - cVar1 & 0x3f);
  if (0x1d < x) {
    uVar3 = lVar2 + 8U << (cVar1 - 3U & 0x3f);
  }
  return uVar3;
}

Assistant:

SQLITE_PRIVATE u64 sqlite3LogEstToInt(LogEst x){
  u64 n;
  n = x%10;
  x /= 10;
  if( n>=5 ) n -= 2;
  else if( n>=1 ) n -= 1;
#if defined(SQLITE_ENABLE_STMT_SCANSTATUS) || \
    defined(SQLITE_EXPLAIN_ESTIMATED_ROWS)
  if( x>60 ) return (u64)LARGEST_INT64;
#else
  /* If only SQLITE_ENABLE_STAT3_OR_STAT4 is on, then the largest input
  ** possible to this routine is 310, resulting in a maximum x of 31 */
  assert( x<=60 );
#endif
  return x>=3 ? (n+8)<<(x-3) : (n+8)>>(3-x);
}